

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9HashmapLookup(jx9_hashmap *pMap,jx9_value *pKey,jx9_hashmap_node **ppNode)

{
  sxu32 nKeyLen;
  int iVar1;
  uint uVar2;
  sxi32 sVar3;
  jx9_hashmap_node *local_20;
  
  if (pMap->nEntry == 0) {
    return -6;
  }
  local_20 = (jx9_hashmap_node *)0x0;
  uVar2 = pKey->iFlags;
  if ((uVar2 & 0x141) != 0) {
    if ((uVar2 & 1) == 0) {
      jx9MemObjToString(pKey);
    }
    nKeyLen = (pKey->sBlob).nByte;
    if (nKeyLen != 0) {
      iVar1 = HashmapLookupBlobKey(pMap,(pKey->sBlob).pBlob,nKeyLen,&local_20);
      goto LAB_0011f685;
    }
    uVar2 = pKey->iFlags;
  }
  if ((uVar2 & 2) == 0) {
    jx9MemObjToInteger(pKey);
  }
  iVar1 = HashmapLookupIntKey(pMap,(pKey->x).iVal,&local_20);
LAB_0011f685:
  sVar3 = -6;
  if (iVar1 == 0) {
    sVar3 = 0;
    if (ppNode != (jx9_hashmap_node **)0x0) {
      *ppNode = local_20;
      sVar3 = 0;
    }
  }
  return sVar3;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapLookup(
	jx9_hashmap *pMap,        /* Target hashmap */
	jx9_value *pKey,          /* Lookup key */
	jx9_hashmap_node **ppNode /* OUT: Target node on success */
	)
{
	sxi32 rc;
	if( pMap->nEntry < 1 ){
		/* TICKET 1433-25: Don't bother hashing, the hashmap is empty anyway.
		 */
		return SXERR_NOTFOUND;
	}
	rc = HashmapLookup(&(*pMap), &(*pKey), ppNode);
	return rc;
}